

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

bool clip_image_batch_encode
               (clip_ctx *ctx,int n_threads,clip_image_f32_batch *imgs_c_ptr,float *vec)

{
  long lVar1;
  ulong uVar2;
  float *pfVar3;
  uint uVar4;
  size_type sVar5;
  pointer pgVar6;
  pointer pcVar7;
  reference pvVar8;
  undefined8 uVar9;
  size_t sVar10;
  reference this;
  void *pvVar11;
  reference pvVar12;
  int *piVar13;
  undefined8 uVar14;
  undefined8 in_RCX;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  double dVar15;
  undefined1 auVar16 [12];
  ggml_tensor *embeddings;
  ggml_status status;
  int i_8;
  int *patches_data;
  int patch_offset;
  ggml_tensor *patches;
  int i_7;
  int *positions_data_2;
  ggml_tensor *positions_2;
  int i_6;
  int i_5;
  ggml_tensor *pos;
  vector<int,_std::allocator<int>_> pos_data;
  int n_patches_per_col;
  int dx;
  int dy;
  int x_1;
  int y_1;
  int ptr;
  int *positions_data_1;
  int ph;
  int pw;
  ggml_tensor *positions_1;
  void *zero_mem;
  ggml_tensor *embeddings_1;
  int j_1;
  int i_4;
  float *pos_embed_data;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  pos_embed_t;
  int embed_dim;
  ggml_tensor *pos_embed;
  int j;
  int id;
  int i_3;
  int i_2;
  int i_1;
  int bucket_coords_w [1024];
  int bucket_coords_h [1024];
  int *positions_data;
  ggml_tensor *positions;
  size_t base_dst;
  size_t base_src;
  int x;
  int y;
  float *batch_entry;
  int b;
  int n;
  int ny;
  int nx;
  size_t i;
  float *data;
  vector<float,_std::allocator<float>_> inp_data;
  ggml_tensor *inp_raw;
  int pos_h;
  int pos_w;
  int num_positions;
  int num_patches;
  int patch_size;
  int image_size_height;
  int image_size_width;
  int image_size;
  bool support_dynamic_size;
  clip_hparams *hparams;
  clip_vision_model *model;
  ggml_cgraph *gf;
  int batch_size;
  clip_image_f32_batch *imgs;
  int *in_stack_ffffffffffffdcb8;
  unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *in_stack_ffffffffffffdcc0;
  undefined8 in_stack_ffffffffffffdcc8;
  undefined1 is_inf;
  allocator_type *in_stack_ffffffffffffdcd0;
  clip_ctx *in_stack_ffffffffffffdcd8;
  void *pvVar17;
  clip_image_size in_stack_ffffffffffffdce0;
  bool local_2211;
  int local_2204;
  int local_21e4;
  int local_21d0;
  int local_21cc;
  vector<int,_std::allocator<int>_> local_21b8;
  int local_21a0;
  int local_219c;
  int local_2198;
  int local_2194;
  int local_2190;
  int local_218c;
  void *local_2188;
  int local_2180;
  int local_217c;
  undefined8 local_2178;
  void *local_2170;
  undefined8 local_2168;
  int local_2160;
  int local_215c;
  void *local_2158;
  pair<int,_int> local_2150;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_2148;
  int local_212c;
  undefined8 local_2128;
  int local_211c;
  int local_2118;
  int local_2114;
  int local_2110;
  int iVar18;
  pair<int,_int> in_stack_ffffffffffffdef8;
  int aiStack_1108 [1024];
  void *local_108;
  undefined8 local_100;
  long local_f8;
  size_type local_f0;
  int local_e8;
  int local_e4;
  float *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  ulong local_c8;
  float *local_c0;
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  bool local_59;
  int *local_58;
  int *local_50;
  undefined8 local_48;
  ggml_cgraph *local_40;
  int local_34;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *local_30;
  undefined8 local_28;
  undefined4 local_14;
  long local_10;
  bool local_1;
  
  is_inf = (undefined1)((ulong)in_stack_ffffffffffffdcc8 >> 0x38);
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    if ((int)g_logger_state.verbosity_thold < 5) {
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: This gguf file seems to have no vision encoder\n",
                        "clip_image_batch_encode");
    }
    local_1 = false;
  }
  else {
    local_30 = in_RDX;
    local_28 = in_RCX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    sVar5 = std::
            vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
            ::size(in_RDX);
    local_34 = (int)sVar5;
    if (((*(byte *)(local_10 + 2) & 1) != 0) && (local_34 != 1)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                 ,0xae3,"GGML_ASSERT(%s) failed","batch_size == 1");
    }
    if (((*(byte *)(local_10 + 3) & 1) != 0) && (local_34 != 1)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                 ,0xae6,"GGML_ASSERT(%s) failed","batch_size == 1");
    }
    if (((*(byte *)(local_10 + 4) & 1) != 0) && (local_34 != 1)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                 ,0xae9,"GGML_ASSERT(%s) failed","batch_size == 1");
    }
    pgVar6 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                       (in_stack_ffffffffffffdcc0);
    ggml_backend_sched_reset(pgVar6);
    local_48 = *(undefined8 *)(local_10 + 0x3a8);
    local_40 = clip_image_build_graph
                         (in_stack_ffffffffffffdcd8,
                          (clip_image_f32_batch *)in_stack_ffffffffffffdcd0,
                          in_stack_ffffffffffffdce0,(bool)is_inf);
    pgVar6 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                       (in_stack_ffffffffffffdcc0);
    ggml_backend_sched_alloc_graph(pgVar6,local_40);
    local_58 = (int *)(local_10 + 0x10);
    local_2211 = true;
    if (((*(byte *)(local_10 + 3) & 1) == 0) &&
       (local_2211 = true, (*(byte *)(local_10 + 5) & 1) == 0)) {
      local_2211 = *(int *)(local_10 + 0x300) == 9;
    }
    local_59 = local_2211;
    local_68 = *local_58;
    local_64 = local_68;
    local_60 = local_68;
    local_50 = local_58;
    if (local_2211 != false) {
      std::
      vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
      ::operator[](local_30,0);
      pcVar7 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                         ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1a1680);
      local_64 = pcVar7->nx;
      std::
      vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
      ::operator[](local_30,0);
      pcVar7 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                         ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1a16a2);
      local_68 = pcVar7->ny;
    }
    local_6c = local_58[1];
    local_70 = (local_64 / local_6c) * (local_68 / local_6c);
    local_74 = (local_70 + 1) - (uint)(*(long *)(local_50 + 0x22) == 0);
    local_78 = *(int *)(local_10 + 0x3a8) / local_6c;
    local_7c = *(int *)(local_10 + 0x3ac) / local_6c;
    local_88 = ggml_graph_get_tensor
                         (local_40,"inp_raw",
                          (long)*(int *)(local_10 + 0x3ac) % (long)local_6c & 0xffffffff);
    ggml_nelements(local_88);
    std::allocator<float>::allocator((allocator<float> *)0x1a179b);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffdce0,
               (size_type)in_stack_ffffffffffffdcd8,(allocator_type *)in_stack_ffffffffffffdcd0);
    std::allocator<float>::~allocator((allocator<float> *)0x1a17c7);
    local_c0 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x1a17d4);
    for (local_c8 = 0; uVar2 = local_c8,
        sVar5 = std::
                vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                ::size(local_30), uVar14 = local_88, pfVar3 = local_c0, uVar2 < sVar5;
        local_c8 = local_c8 + 1) {
      std::
      vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
      ::operator[](local_30,local_c8);
      pcVar7 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                         ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1a1836);
      local_cc = pcVar7->nx;
      std::
      vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
      ::operator[](local_30,local_c8);
      pcVar7 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                         ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1a185c);
      local_d0 = pcVar7->ny;
      if ((((((*(byte *)(local_10 + 4) & 1) != 0) || ((*(byte *)(local_10 + 2) & 1) != 0)) ||
           (*(int *)(local_10 + 0x300) == 7)) || (*(int *)(local_10 + 0x300) == 8)) &&
         ((local_cc != local_60 || (local_d0 != local_60)))) {
        auVar16 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                             ,0xb1f,"GGML_ASSERT(%s) failed","nx == image_size && ny == image_size")
        ;
        local_b4 = auVar16._8_4_;
        local_b0 = auVar16._0_8_;
        std::allocator<float>::~allocator((allocator<float> *)0x1a190c);
        _Unwind_Resume(local_b0);
      }
      local_d4 = local_cc * local_d0;
      for (local_d8 = 0; local_d8 < local_34; local_d8 = local_d8 + 1) {
        local_e0 = local_c0 + local_d8 * local_d4 * 3;
        for (local_e4 = 0; local_e4 < local_d0; local_e4 = local_e4 + 1) {
          for (local_e8 = 0; local_e8 < local_cc; local_e8 = local_e8 + 1) {
            local_f0 = (size_type)((local_e4 * local_cc + local_e8) * 3);
            local_f8 = (long)(local_e4 * local_cc + local_e8);
            std::
            vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
            ::operator[](local_30,(long)local_d8);
            pcVar7 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                               ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1a1a38);
            pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&pcVar7->buf,local_f0);
            local_e0[local_f8] = *pvVar8;
            std::
            vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
            ::operator[](local_30,(long)local_d8);
            pcVar7 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                               ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1a1a82);
            pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&pcVar7->buf,local_f0 + 1);
            local_e0[local_d4 + local_f8] = *pvVar8;
            std::
            vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
            ::operator[](local_30,(long)local_d8);
            pcVar7 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                               ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1a1add);
            pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&pcVar7->buf,local_f0 + 2);
            local_e0[(local_d4 << 1) + local_f8] = *pvVar8;
          }
        }
      }
    }
    uVar9 = ggml_nbytes();
    ggml_backend_tensor_set(uVar14,pfVar3,0,uVar9);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffdcd0);
    if ((*(byte *)(local_10 + 3) & 1) == 0) {
      if (*(long *)(local_50 + 0x22) != 0) {
        local_2168 = ggml_graph_get_tensor(local_40);
        sVar10 = ggml_nbytes(local_2168);
        pvVar11 = malloc(sVar10);
        local_2170 = pvVar11;
        sVar10 = ggml_nbytes(local_2168);
        memset(pvVar11,0,sVar10);
        uVar14 = local_2168;
        pvVar11 = local_2170;
        uVar9 = ggml_nbytes(local_2168);
        ggml_backend_tensor_set(uVar14,pvVar11,0,uVar9);
        free(local_2170);
      }
      if ((*(byte *)(local_10 + 5) & 1) == 0) {
        if ((*(int *)(local_10 + 0x300) != 7) && (*(int *)(local_10 + 0x300) != 8)) {
          if (*(int *)(local_10 + 0x300) == 9) {
            local_21a0 = local_64 / local_6c;
            std::allocator<int>::allocator((allocator<int> *)0x1a23f1);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdce0,
                       (size_type)in_stack_ffffffffffffdcd8,in_stack_ffffffffffffdcd0);
            std::allocator<int>::~allocator((allocator<int> *)0x1a241d);
            uVar14 = ggml_graph_get_tensor(local_40,"pos_h");
            for (local_21cc = 0; local_21cc < local_74; local_21cc = local_21cc + 1) {
              iVar18 = local_21cc / local_21a0;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_21b8,(long)local_21cc);
              *pvVar12 = iVar18;
            }
            piVar13 = std::vector<int,_std::allocator<int>_>::data
                                ((vector<int,_std::allocator<int>_> *)0x1a2511);
            uVar9 = ggml_nbytes(uVar14);
            ggml_backend_tensor_set(uVar14,piVar13,0,uVar9);
            uVar14 = ggml_graph_get_tensor(local_40,"pos_w");
            for (local_21d0 = 0; local_21d0 < local_74; local_21d0 = local_21d0 + 1) {
              iVar18 = local_21d0 % local_21a0;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_21b8,(long)local_21d0);
              *pvVar12 = iVar18;
            }
            piVar13 = std::vector<int,_std::allocator<int>_>::data
                                ((vector<int,_std::allocator<int>_> *)0x1a25e2);
            uVar9 = ggml_nbytes(uVar14);
            ggml_backend_tensor_set(uVar14,piVar13,0,uVar9);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdcd0);
          }
          else {
            uVar14 = ggml_graph_get_tensor(local_40,"positions");
            sVar10 = ggml_nbytes(uVar14);
            pvVar11 = malloc(sVar10);
            for (local_21e4 = 0; local_21e4 < local_74; local_21e4 = local_21e4 + 1) {
              *(int *)((long)pvVar11 + (long)local_21e4 * 4) = local_21e4;
            }
            uVar9 = ggml_nbytes(uVar14);
            ggml_backend_tensor_set(uVar14,pvVar11,0,uVar9);
            free(pvVar11);
            if ((*(byte *)(local_10 + 4) & 1) == 0) {
              uVar14 = ggml_graph_get_tensor(local_40,"patches");
              lVar1 = *(long *)(local_50 + 0x22);
              sVar10 = ggml_nbytes(uVar14);
              pvVar11 = malloc(sVar10);
              for (local_2204 = 0; local_2204 < local_70; local_2204 = local_2204 + 1) {
                *(uint *)((long)pvVar11 + (long)local_2204 * 4) = local_2204 + (uint)(lVar1 != 0);
              }
              pvVar17 = pvVar11;
              uVar9 = ggml_nbytes(uVar14);
              ggml_backend_tensor_set(uVar14,pvVar17,0,uVar9);
              free(pvVar11);
            }
          }
        }
      }
      else {
        local_2178 = ggml_graph_get_tensor(local_40,"positions");
        local_217c = local_64 / local_6c;
        local_2180 = local_68 / local_6c;
        sVar10 = ggml_nbytes(local_2178);
        pvVar11 = malloc(sVar10);
        uVar14 = local_2178;
        local_218c = 0;
        for (local_2190 = 0; local_2190 < local_2180; local_2190 = local_2190 + 2) {
          for (local_2194 = 0; local_2194 < local_217c; local_2194 = local_2194 + 2) {
            for (local_2198 = 0; local_2198 < 2; local_2198 = local_2198 + 1) {
              for (local_219c = 0; local_219c < 2; local_219c = local_219c + 1) {
                *(int *)((long)pvVar11 + (long)local_218c * 4) = local_2190 + local_2198;
                *(int *)((long)pvVar11 + (long)(local_70 + local_218c) * 4) =
                     local_2194 + local_219c;
                *(int *)((long)pvVar11 + (long)(local_70 * 2 + local_218c) * 4) =
                     local_2190 + local_2198;
                *(int *)((long)pvVar11 + (long)(local_70 * 3 + local_218c) * 4) =
                     local_2194 + local_219c;
                local_218c = local_218c + 1;
              }
            }
          }
        }
        local_2188 = pvVar11;
        uVar9 = ggml_nbytes(local_2178);
        ggml_backend_tensor_set(uVar14,pvVar11,0,uVar9);
        free(local_2188);
      }
    }
    else {
      local_100 = ggml_graph_get_tensor(local_40,"positions");
      sVar10 = ggml_nbytes(local_100);
      local_108 = malloc(sVar10);
      for (iVar18 = 0; iVar18 < local_7c; iVar18 = iVar18 + 1) {
        dVar15 = floor(((double)iVar18 * 70.0) / (double)local_7c);
        aiStack_1108[iVar18] = (int)dVar15;
      }
      for (local_2110 = 0; uVar14 = local_100, pvVar11 = local_108, local_2110 < local_78;
          local_2110 = local_2110 + 1) {
        dVar15 = floor(((double)local_2110 * 70.0) / (double)local_78);
        *(int *)(&stack0xffffffffffffdef8 + (long)local_2110 * 4) = (int)dVar15;
      }
      local_2118 = 0;
      for (local_2114 = 0; local_2114 < local_7c; local_2114 = local_2114 + 1) {
        for (local_211c = 0; local_211c < local_78; local_211c = local_211c + 1) {
          *(int *)((long)local_108 + (long)local_2118 * 4) =
               aiStack_1108[local_2114] * 0x46 +
               *(int *)(&stack0xffffffffffffdef8 + (long)local_211c * 4);
          local_2118 = local_2118 + 1;
        }
      }
      uVar9 = ggml_nbytes(local_100);
      ggml_backend_tensor_set(uVar14,pvVar11,0,uVar9);
      free(local_108);
      local_2128 = ggml_graph_get_tensor(local_40,"pos_embed");
      local_212c = 0x1000;
      if (*(int *)(local_10 + 8) == 2) {
        local_212c = 0x1000;
      }
      else if (*(int *)(local_10 + 8) == 3) {
        local_212c = 0xe00;
      }
      else if (*(int *)(local_10 + 8) == 4) {
        local_212c = 0xe00;
      }
      local_2150 = std::make_pair<int_const&,int_const&>(in_stack_ffffffffffffdcb8,(int *)0x1a1e98);
      get_2d_sincos_pos_embed(iVar18,in_stack_ffffffffffffdef8);
      sVar10 = ggml_nbytes(local_2128);
      local_2158 = malloc(sVar10);
      for (local_215c = 0; local_215c < local_78 * local_7c; local_215c = local_215c + 1) {
        for (local_2160 = 0; local_2160 < local_212c; local_2160 = local_2160 + 1) {
          this = std::
                 vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ::operator[](&local_2148,(long)local_215c);
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](this,(long)local_2160);
          *(value_type *)((long)local_2158 + (long)(local_215c * local_212c + local_2160) * 4) =
               *pvVar8;
        }
      }
      uVar14 = local_2128;
      pvVar11 = local_2158;
      uVar9 = ggml_nbytes();
      ggml_backend_tensor_set(uVar14,pvVar11,0,uVar9);
      free(local_2158);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)in_stack_ffffffffffffdcd0);
    }
    ggml_backend_cpu_set_n_threads(*(undefined8 *)(local_10 + 0x388),local_14);
    pgVar6 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                       (in_stack_ffffffffffffdcc0);
    uVar4 = ggml_backend_sched_graph_compute(pgVar6,local_40);
    if (uVar4 == 0) {
      uVar14 = ggml_graph_node(local_40,0xffffffff);
      uVar9 = ggml_nbytes(uVar14);
      ggml_backend_tensor_get(uVar14,local_28,0,uVar9);
      local_1 = true;
    }
    else {
      if ((int)g_logger_state.verbosity_thold < 5) {
        clip_log_internal(GGML_LOG_LEVEL_ERROR,
                          "%s: ggml_backend_sched_graph_compute failed with error %d\n",
                          "clip_image_batch_encode",(ulong)uVar4);
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool clip_image_batch_encode(clip_ctx * ctx, const int n_threads, const clip_image_f32_batch * imgs_c_ptr, float * vec) {
    const clip_image_f32_batch & imgs = *imgs_c_ptr;

    if (!ctx->has_vision_encoder) {
        LOG_ERR("%s: This gguf file seems to have no vision encoder\n", __func__);
        return false;
    }

    int batch_size = imgs.entries.size();
    if (ctx->has_llava_projector) {
        GGML_ASSERT(batch_size == 1); // TODO: support multiple images
    }
    if (ctx->has_minicpmv_projector) {
        GGML_ASSERT(batch_size == 1);
    }
    if (ctx->has_glm_projector) {
        GGML_ASSERT(batch_size == 1);
    }

    // build the inference graph
    ggml_backend_sched_reset(ctx->sched.get());
    ggml_cgraph * gf = clip_image_build_graph(ctx, imgs, ctx->load_image_size, true);
    ggml_backend_sched_alloc_graph(ctx->sched.get(), gf);

    // set inputs
    const auto & model = ctx->vision_model;
    const auto & hparams = model.hparams;

    // TODO @ngxson : this is ugly, need to refactor later
    bool support_dynamic_size = ctx->has_minicpmv_projector
        || ctx->has_qwen2vl_merger
        || ctx->proj_type == PROJECTOR_TYPE_PIXTRAL;

    const int image_size = hparams.image_size;
    int image_size_width  = image_size;
    int image_size_height = image_size;
    if (support_dynamic_size) {
        image_size_width  = imgs.entries[0]->nx;
        image_size_height = imgs.entries[0]->ny;
    }
    const int patch_size    = hparams.patch_size;
    const int num_patches   = ((image_size_width / patch_size) * (image_size_height / patch_size));
    const int num_positions = num_patches + (model.class_embedding ? 1 : 0);
    const int pos_w = ctx->load_image_size.width / patch_size;
    const int pos_h = ctx->load_image_size.height / patch_size;

    {
        struct ggml_tensor * inp_raw = ggml_graph_get_tensor(gf, "inp_raw");
        std::vector<float> inp_data(ggml_nelements(inp_raw));
        float * data = inp_data.data();

        // layout of data (note: the channel dim is unrolled to better visualize the layout):
        //
        // ┌──W──┐
        // │     H │  channel = R
        // ├─────┤ │
        // │     H │  channel = G
        // ├─────┤ │
        // │     H │  channel = B
        // └─────┘ │
        //   ──────┘ x B

        for (size_t i = 0; i < imgs.entries.size(); i++) {
            const int nx = imgs.entries[i]->nx;
            const int ny = imgs.entries[i]->ny;

            if (ctx->has_glm_projector
                    || ctx->has_llava_projector
                    || ctx->proj_type == PROJECTOR_TYPE_GEMMA3
                    || ctx->proj_type == PROJECTOR_TYPE_IDEFICS3) {
                GGML_ASSERT(nx == image_size && ny == image_size);
            }

            const int n = nx * ny;

            for (int b = 0; b < batch_size; b++) {
                float * batch_entry = data + b * (3*n);
                for (int y = 0; y < ny; y++) {
                    for (int x = 0; x < nx; x++) {
                        size_t base_src = 3*(y * nx + x); // idx of the first channel
                        size_t base_dst =    y * nx + x;  // idx of the first channel
                        batch_entry[      base_dst] = imgs.entries[b]->buf[base_src    ];
                        batch_entry[1*n + base_dst] = imgs.entries[b]->buf[base_src + 1];
                        batch_entry[2*n + base_dst] = imgs.entries[b]->buf[base_src + 2];
                    }
                }
            }
        }
        ggml_backend_tensor_set(inp_raw, data, 0, ggml_nbytes(inp_raw));
    }
    if (ctx->has_minicpmv_projector) {
        {
            // inspired from siglip:
            //    -> https://huggingface.co/HuggingFaceM4/siglip-so400m-14-980-flash-attn2-navit
            //    -> https://huggingface.co/HuggingFaceM4/siglip-so400m-14-980-flash-attn2-navit/blob/d66538faeba44480d0bfaa42145eef26f9423199/modeling_siglip.py#L316
            struct ggml_tensor * positions = ggml_graph_get_tensor(gf, "positions");
            int* positions_data = (int*)malloc(ggml_nbytes(positions));
            int bucket_coords_h[1024];
            int bucket_coords_w[1024];
            for (int i = 0; i < pos_h; i++){
                bucket_coords_h[i] = std::floor(70.0*i/pos_h);
            }
            for (int i = 0; i < pos_w; i++){
                bucket_coords_w[i] = std::floor(70.0*i/pos_w);
            }
            for (int i = 0, id = 0; i < pos_h; i++){
                for (int j = 0; j < pos_w; j++){
                    positions_data[id++] = bucket_coords_h[i]*70 + bucket_coords_w[j];
                }
            }
            ggml_backend_tensor_set(positions, positions_data, 0, ggml_nbytes(positions));
            free(positions_data);
        }

        {
            // inspired from resampler of Qwen-VL:
            //    -> https://huggingface.co/Qwen/Qwen-VL/tree/main
            //    -> https://huggingface.co/Qwen/Qwen-VL/blob/0547ed36a86561e2e42fecec8fd0c4f6953e33c4/visual.py#L23
            struct ggml_tensor * pos_embed = ggml_graph_get_tensor(gf, "pos_embed");
            int embed_dim = 4096;
            if (ctx->minicpmv_version == 2) {
                embed_dim = 4096;
            }
            else if (ctx->minicpmv_version == 3) {
                embed_dim = 3584;
            }
            else if (ctx->minicpmv_version == 4) {
                embed_dim = 3584;
            }
            auto pos_embed_t = get_2d_sincos_pos_embed(embed_dim, std::make_pair(pos_w, pos_h));

            float * pos_embed_data = (float *)malloc(ggml_nbytes(pos_embed));
            for(int i=0;i < pos_w * pos_h; ++i){
                for(int j=0; j < embed_dim; ++j){
                    pos_embed_data[i * embed_dim + j] = pos_embed_t[i][j];
                }
            }

            ggml_backend_tensor_set(pos_embed, pos_embed_data, 0, ggml_nbytes(pos_embed));
            free(pos_embed_data);
        }
    }
    else {
        if (model.class_embedding) {
            struct ggml_tensor * embeddings = ggml_graph_get_tensor(gf, "embeddings");

            void* zero_mem = malloc(ggml_nbytes(embeddings));
            memset(zero_mem, 0, ggml_nbytes(embeddings));
            ggml_backend_tensor_set(embeddings, zero_mem, 0, ggml_nbytes(embeddings));
            free(zero_mem);
        }

        if (ctx->has_qwen2vl_merger) {
            struct ggml_tensor * positions = ggml_graph_get_tensor(gf, "positions");

            const int pw = image_size_width / patch_size;
            const int ph = image_size_height / patch_size;
            int* positions_data = (int*)malloc(ggml_nbytes(positions));

            int ptr = 0;
            for (int y = 0; y < ph; y+=2)
            {
                for (int x = 0; x < pw; x+=2)
                {
                    for (int dy = 0; dy < 2; dy++) {
                        for (int dx = 0; dx < 2; dx++) {
                            positions_data[ptr]                 = y + dy;
                            positions_data[num_patches + ptr]     = x + dx;
                            positions_data[num_patches * 2 + ptr] = y + dy;
                            positions_data[num_patches * 3 + ptr] = x + dx;
                            ptr++;
                        }
                    }
                }
            }

            ggml_backend_tensor_set(positions, positions_data, 0, ggml_nbytes(positions));
            free(positions_data);
        }
        else if (ctx->proj_type == PROJECTOR_TYPE_GEMMA3) {
            // do nothing
        }
        else if (ctx->proj_type == PROJECTOR_TYPE_IDEFICS3) {
            // do nothing
        }
        else if (ctx->proj_type == PROJECTOR_TYPE_PIXTRAL) {
            // set the 2D positions
            int n_patches_per_col = image_size_width / patch_size;
            std::vector<int> pos_data(num_positions);
            struct ggml_tensor * pos;
            // dimension H
            pos = ggml_graph_get_tensor(gf, "pos_h");
            for (int i = 0; i < num_positions; i++) {
                pos_data[i] = i / n_patches_per_col;
            }
            ggml_backend_tensor_set(pos, pos_data.data(), 0, ggml_nbytes(pos));
            // dimension W
            pos = ggml_graph_get_tensor(gf, "pos_w");
            for (int i = 0; i < num_positions; i++) {
                pos_data[i] = i % n_patches_per_col;
            }
            ggml_backend_tensor_set(pos, pos_data.data(), 0, ggml_nbytes(pos));
        }
        else {
            struct ggml_tensor * positions = ggml_graph_get_tensor(gf, "positions");

            int* positions_data = (int*)malloc(ggml_nbytes(positions));
            for (int i = 0; i < num_positions; i++) {
                positions_data[i] = i;
            }
            ggml_backend_tensor_set(positions, positions_data, 0, ggml_nbytes(positions));
            free(positions_data);

            if (!ctx->has_glm_projector) {
                struct ggml_tensor * patches = ggml_graph_get_tensor(gf, "patches");
                // The patches vector is used to get rows to index into the embeds with;
                // we should skip dim 0 only if we have CLS to avoid going out of bounds
                // when retrieving the rows.
                int patch_offset = model.class_embedding ? 1 : 0;
                int* patches_data = (int*)malloc(ggml_nbytes(patches));
                for (int i = 0; i < num_patches; i++) {
                    patches_data[i] = i + patch_offset;
                }
                ggml_backend_tensor_set(patches, patches_data, 0, ggml_nbytes(patches));
                free(patches_data);
            }
        }
    }

    ggml_backend_cpu_set_n_threads(ctx->backend_cpu, n_threads);

    auto status = ggml_backend_sched_graph_compute(ctx->sched.get(), gf);
    if (status != GGML_STATUS_SUCCESS) {
        LOG_ERR("%s: ggml_backend_sched_graph_compute failed with error %d\n", __func__, status);
        return false;
    }

    // the last node is the embedding tensor
    struct ggml_tensor * embeddings = ggml_graph_node(gf, -1);

    // copy the embeddings to the location passed by the user
    ggml_backend_tensor_get(embeddings, vec, 0, ggml_nbytes(embeddings));

    return true;
}